

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa-generate.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  allocator<char> local_31;
  string local_30 [32];
  
  if (argc < 2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"verifyrsa - https://github.com/rodlie/verifyrsa"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Usage: rsa-generate <key suffix> <bits>");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar2 = 0;
  }
  else {
    iVar2 = 0x800;
    if (argc != 2) {
      iVar2 = atoi(argv[2]);
    }
    std::__cxx11::string::string<std::allocator<char>>(local_30,argv[1],&local_31);
    cVar1 = VerifyRSA::generate(local_30,iVar2);
    std::__cxx11::string::~string(local_30);
    iVar2 = 0;
    if (cVar1 == '\0') {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Unable to generate keys!");
      std::endl<char,std::char_traits<char>>(poVar3);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int main(int argc, char* argv[]) {
    if (argc<2) {
        std::cout << "verifyrsa - https://github.com/rodlie/verifyrsa" << std::endl;
        std::cout << "" << std::endl;
        std::cout << "Usage: rsa-generate <key suffix> <bits>" << std::endl;
        return 0;
    }
    int bits = argc>2?atoi(argv[2]):2048;
    if (!VerifyRSA::generate(argv[1], bits)) {
        std::cerr << "Unable to generate keys!" << std::endl;
        return 1;
    }
    return 0;
}